

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v10::detail::format_uint<1u,char,fmt::v10::appender,unsigned_int>
                   (appender out,uint value,int num_digits,bool upper)

{
  type tVar1;
  char *buffer_00;
  char local_68 [8];
  char buffer [33];
  char *ptr;
  bool upper_local;
  int num_digits_local;
  uint value_local;
  appender out_local;
  
  tVar1 = to_unsigned<int>(num_digits);
  buffer_00 = to_pointer<char>((buffer_appender<char>)
                               out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                               container,(ulong)tVar1);
  if (buffer_00 == (char *)0x0) {
    memset(local_68,0,0x21);
    format_uint<1u,char,unsigned_int>(local_68,value,num_digits,upper);
    out_local = copy_str_noinline<char,char*,fmt::v10::appender>(local_68,local_68 + num_digits,out)
    ;
  }
  else {
    format_uint<1u,char,unsigned_int>(buffer_00,value,num_digits,upper);
    out_local.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container =
         out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
  }
  return (appender)
         out_local.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
}

Assistant:

FMT_CONSTEXPR inline auto format_uint(It out, UInt value, int num_digits,
                                      bool upper = false) -> It {
  if (auto ptr = to_pointer<Char>(out, to_unsigned(num_digits))) {
    format_uint<BASE_BITS>(ptr, value, num_digits, upper);
    return out;
  }
  // Buffer should be large enough to hold all digits (digits / BASE_BITS + 1).
  char buffer[num_bits<UInt>() / BASE_BITS + 1] = {};
  format_uint<BASE_BITS>(buffer, value, num_digits, upper);
  return detail::copy_str_noinline<Char>(buffer, buffer + num_digits, out);
}